

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

int generator_segment_mix(mixed_segment *segment)

{
  float fVar1;
  double dVar2;
  uint local_40;
  uint32_t local_3c;
  uint32_t i;
  uint32_t samples;
  float *out;
  code *pcStack_28;
  float volume;
  _func_float_float_double_float *generator;
  undefined8 *puStack_18;
  uint32_t phase;
  generator_segment_data *data;
  mixed_segment *segment_local;
  
  puStack_18 = (undefined8 *)segment->data;
  generator._4_4_ = (uint)(long)(double)puStack_18[2];
  pcStack_28 = (code *)0x0;
  out._4_4_ = *(float *)((long)puStack_18 + 0x1c);
  switch(*(undefined4 *)(puStack_18 + 1)) {
  case 1:
    pcStack_28 = sine_wave;
    break;
  case 2:
    pcStack_28 = square_wave;
    break;
  case 3:
    pcStack_28 = triangle_wave;
    break;
  case 4:
    pcStack_28 = sawtooth_wave;
  }
  local_3c = 0xffffffff;
  data = (generator_segment_data *)segment;
  mixed_buffer_request_write((float **)&i,&local_3c,(mixed_buffer *)*puStack_18);
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    fVar1 = (float)(*pcStack_28)(*(undefined4 *)((long)puStack_18 + 0xc),(double)generator._4_4_,
                                 (float)*(uint *)(puStack_18 + 3));
    _i[local_40] = fVar1 * out._4_4_;
    dVar2 = fmod((double)(generator._4_4_ + 1),(double)*(uint *)(puStack_18 + 3));
    generator._4_4_ = (uint)(long)dVar2;
  }
  mixed_buffer_finish_write(local_3c,(mixed_buffer *)*puStack_18);
  puStack_18[2] = (double)generator._4_4_;
  return 1;
}

Assistant:

int generator_segment_mix(struct mixed_segment *segment){
  struct generator_segment_data *data = (struct generator_segment_data *)segment->data;
  uint32_t phase = data->phase;
  float (*generator)(float frequency, double phase, float samplerate) = 0;
  float volume = data->volume;

  switch(data->type){
  case MIXED_SINE: generator = sine_wave; break;
  case MIXED_SQUARE: generator = square_wave; break;
  case MIXED_TRIANGLE: generator = triangle_wave; break;
  case MIXED_SAWTOOTH: generator = sawtooth_wave; break;
  }
  
  float *restrict out;
  uint32_t samples = UINT32_MAX;
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = generator(data->frequency, phase, data->samplerate) * volume;
    phase = fmod(phase+1, data->samplerate);
  }
  mixed_buffer_finish_write(samples, data->out);

  data->phase = phase;
  return 1;
}